

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_nodes.h
# Opt level: O2

vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_> *
__thiscall
spvtools::opt::SENode::CollectRecurrentNodes
          (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
           *__return_storage_ptr__,SENode *this)

{
  pointer ppSVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer ppSVar3;
  SERecurrentNode *recurrent_node;
  _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (*this->_vptr_SENode[6])(this);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar2);
  if (local_38._M_impl.super__Vector_impl_data._M_start != (SERecurrentNode **)0x0) {
    std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_38);
  }
  ppSVar1 = (this->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar3 = (this->children_).
                 super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar3 != ppSVar1;
      ppSVar3 = ppSVar3 + 1) {
    CollectRecurrentNodes
              ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)&local_38,*ppSVar3);
    std::vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>::
    insert<__gnu_cxx::__normal_iterator<spvtools::opt::SERecurrentNode**,std::vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>>,void>
              ((vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>
                *)__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
                )local_38._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
                )local_38._M_impl.super__Vector_impl_data._M_finish);
    std::
    _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
    ::~_Vector_base(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SERecurrentNode*> CollectRecurrentNodes() {
    std::vector<SERecurrentNode*> recurrent_nodes{};

    if (auto recurrent_node = AsSERecurrentNode()) {
      recurrent_nodes.push_back(recurrent_node);
    }

    for (auto child : GetChildren()) {
      auto child_recurrent_nodes = child->CollectRecurrentNodes();
      recurrent_nodes.insert(recurrent_nodes.end(),
                             child_recurrent_nodes.begin(),
                             child_recurrent_nodes.end());
    }

    return recurrent_nodes;
  }